

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ImGuiIO *pIVar3;
  ImDrawData *draw_data;
  int h;
  double prevT;
  double local_c0;
  ImFontConfig config;
  
  glfwSetErrorCallback(main::anon_class_1_0_00000001::__invoke);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    iVar1 = 1;
    glfwWindowHint(0x20008,1);
    window = glfwCreateWindow(0x500,0x2d0,"test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (window != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(window);
      glfwSwapInterval(0);
      iVar2 = gladLoadGL();
      if (iVar2 == 0) {
        fwrite("Failed to initialize OpenGL loader!\n",0x24,1,_stderr);
      }
      else {
        glad_set_post_callback(glErrorCallback);
        ImGui::CreateContext((ImFontAtlas *)0x0);
        ImPlot::CreateContext();
        pIVar3 = ImGui::GetIO();
        ImGui::StyleColorsDark((ImGuiStyle *)0x0);
        ImGui_ImplGlfw_InitForOpenGL(window,true);
        ImGui_ImplOpenGL3_Init((char *)0x0);
        ImFontAtlas::AddFontDefault(pIVar3->Fonts,(ImFontConfig *)0x0);
        ImFontConfig::ImFontConfig(&config);
        config.MergeMode = true;
        ImFontAtlas::AddFontFromFileTTF
                  (pIVar3->Fonts,"data/OpenFontIcons.ttf",13.0,&config,main::iconRanges);
        (*glad_debug_glEnable)(0xb71);
        (*glad_debug_glDepthMask)('\x01');
        gpu::buildShaders();
        createBasicTextures();
        createAxesMesh();
        createFloorGridMesh();
        createCrosshairMesh();
        glfwSetMouseButtonCallback(window,mouse_handling::onMouseButton);
        glfwSetCursorPosCallback(window,mouse_handling::onMouseMove);
        glfwSetScrollCallback(window,mouse_handling::onMouseWheel);
        glfwSetDropCallback(window,onFileDroped);
        if (1 < argc) {
          loadGltf(argv[1]);
        }
        prevT = glfwGetTime();
        iVar1 = 0;
        while( true ) {
          iVar2 = glfwWindowShouldClose(window);
          if (iVar2 != 0) break;
          local_c0 = glfwGetTime();
          prevT = local_c0 - prevT;
          glfwPollEvents();
          update((float)prevT);
          (*glad_debug_glBindFramebuffer)(0x8d40,0);
          glfwGetFramebufferSize(window,(int *)&config,&h);
          (*glad_debug_glViewport)(0,0,(GLsizei)config.FontData,h);
          (*glad_debug_glScissor)(0,0,(GLsizei)config.FontData,h);
          drawScene();
          ImGui_ImplOpenGL3_NewFrame();
          ImGui_ImplGlfw_NewFrame();
          ImGui::NewFrame();
          ImGui::ShowDemoWindow((bool *)0x0);
          drawGui();
          (*glad_debug_glBindFramebuffer)(0x8d40,0);
          ImGui::Render();
          draw_data = ImGui::GetDrawData();
          ImGui_ImplOpenGL3_RenderDrawData(draw_data);
          glfwSwapBuffers(window);
          glfwWaitEventsTimeout(0.01);
          prevT = local_c0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    glfwSetErrorCallback(+[](int error, const char* description) {
        fprintf(stderr, "Glfw Error %d: %s\n", error, description);
    });
    if (!glfwInit())
        return 1;

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_MAXIMIZED, GLFW_TRUE);

    window = glfwCreateWindow(1280, 720, "test", nullptr, nullptr);
    if (window == nullptr)
        return 1;

    glfwMakeContextCurrent(window);
    glfwSwapInterval(0); // Enable vsync

    if (gladLoadGL() == 0) {
        fprintf(stderr, "Failed to initialize OpenGL loader!\n");
        return 1;
    }
    glad_set_post_callback(glErrorCallback);

    ImGui::CreateContext();
    ImPlot::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;     // Enable Keyboard Controls
    ImGui::StyleColorsDark();
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL3_Init();
    io.Fonts->AddFontDefault();

    { // icons font
        ImFontConfig config;
        config.MergeMode = true;
        //config.GlyphMinAdvanceX = 13; // use if you want to make the icon monospaced
        static const ImWchar iconRanges[] = { 0xe000, 0xF8FF, 0 };
        io.Fonts->AddFontFromFileTTF("data/OpenFontIcons.ttf", 13.f, &config, iconRanges);
    }
    const int fontSize = 18;
    /*{
        ImFontConfig font_cfg = ImFontConfig();
        font_cfg.OversampleH = font_cfg.OversampleV = 4;
        font_cfg.PixelSnapH = true;
        font_cfg.SizePixels = fontSize;
        const char* file = "ProggyClean.ttf";
        tl::toStringBuffer(font_cfg.Name, file, ", ", fontSize, "px");
        font_cfg.EllipsisChar = (ImWchar)0x0085;
        auto font = io.Fonts->AddFontFromFileTTF(file, fontSize, &font_cfg);
        //fonts::roboto->DisplayOffset.y = -1.0f;
    }*/
    /*{
        ImFontConfig font_cfg = ImFontConfig();
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
        const int size = 18;
        font_cfg.SizePixels = size;
        const char* file = "RobotoMono-Regular.ttf";
        tl::toStringBuffer(font_cfg.Name, file, ", ", fontSize, "px");
        font_cfg.EllipsisChar = (ImWchar)0x0085;
        fonts::roboto = io.Fonts->AddFontFromFileTTF(file, fontSize, &font_cfg);
        fonts::roboto->DisplayOffset.y = -1.0f;
    }*/
    /*{
        ImFontConfig font_cfg = ImFontConfig();
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
        font_cfg.SizePixels = fontSize;
        const char* file = "RobotoMono-Bold.ttf";
        tl::toStringBuffer(font_cfg.Name, file, ", ", fontSize, "px");
        font_cfg.EllipsisChar = (ImWchar)0x0085;
        fonts::robotoBold = io.Fonts->AddFontFromFileTTF(file, fontSize, &font_cfg);
        fonts::robotoBold->DisplayOffset.y = -1.0f;
    }*/

    glEnable(GL_DEPTH_TEST);
    glDepthMask(GL_TRUE);

    gpu::buildShaders();
    createBasicTextures();
    createAxesMesh();
    createFloorGridMesh();
    createCrosshairMesh();

    glfwSetMouseButtonCallback(window, mouse_handling::onMouseButton);
    glfwSetCursorPosCallback(window, mouse_handling::onMouseMove);
    glfwSetScrollCallback(window, mouse_handling::onMouseWheel);
    glfwSetDropCallback(window, onFileDroped);
    if(argc > 1) {
        loadGltf(argv[1]);
    }

    double t = glfwGetTime();
    while (!glfwWindowShouldClose(window))
    {
        const double prevT = t;
        t = glfwGetTime();
        const double dt = t - prevT;

        glfwPollEvents();

        update(dt);

        // draw scene
        glBindFramebuffer(GL_FRAMEBUFFER, 0);
        int w, h;
        glfwGetFramebufferSize(window, &w, &h);
        glViewport(0, 0, w, h);
        glScissor(0, 0, w, h);
        drawScene();

        // draw gui
        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();
        ImGui::NewFrame();
        ImGui::ShowDemoWindow();
        drawGui();
        glBindFramebuffer(GL_FRAMEBUFFER, 0);
        ImGui::Render();
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(0.01);
    }
}